

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper.cpp
# Opt level: O1

void qt_alphamapblit_nonpremul_argb32
               (QRasterBuffer *rasterBuffer,int x,int y,QRgba64 *color,uchar *map,int mapWidth,
               int mapHeight,int mapStride,QClipData *clip,bool useGammaCorrection)

{
  _Head_base<0UL,_unsigned_short_*,_false> _Var1;
  DestFetchProc64 p_Var2;
  DestStoreProc64 p_Var3;
  bool bVar4;
  int iVar5;
  QRgba64 srcColor_00;
  uint c;
  QColorTrcLut *colorProfile;
  long lVar6;
  QRgba64 *dest;
  uint uVar7;
  uint uVar8;
  int len;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  int iVar12;
  long in_FS_OFFSET;
  bool bVar13;
  ushort uVar14;
  ushort uVar15;
  ushort uVar16;
  QRgba64 srcColor;
  QRgba64 buffer [2048];
  uchar *local_40b8;
  ulong local_40b0;
  long local_4098;
  QRgba64 local_4040;
  QRgba64 local_4038 [2048];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (clip == (QClipData *)0x0) {
    if (*(short *)((long)&color->rgba + 6) != 0) {
      if (useGammaCorrection) {
        colorProfile = QGuiApplicationPrivate::colorProfileForA8Text(QGuiApplicationPrivate::self);
      }
      else {
        colorProfile = (QColorTrcLut *)0x0;
      }
      c = QRgba64::toArgb32(color);
      local_4040 = (QRgba64)color->rgba;
      uVar14 = (ushort)(local_4040.rgba >> 0x30);
      if (uVar14 == 0xffff && colorProfile != (QColorTrcLut *)0x0) {
        _Var1._M_head_impl =
             (colorProfile->m_toLinear)._M_t.
             super___uniq_ptr_impl<unsigned_short,_std::default_delete<unsigned_short[]>_>._M_t.
             super__Tuple_impl<0UL,_unsigned_short_*,_std::default_delete<unsigned_short[]>_>.
             super__Head_base<0UL,_unsigned_short_*,_false>._M_head_impl;
        uVar15 = (ushort)(local_4040.rgba >> 0x10);
        uVar16 = (ushort)(local_4040.rgba >> 0x20);
        uVar14 = uVar14 - (uVar14 >> 8);
        local_4040.rgba =
             CONCAT26((uVar14 >> 8) + uVar14,
                      CONCAT24((_Var1._M_head_impl[(ushort)(uVar16 - (uVar16 >> 8)) >> 4] >> 8) +
                               _Var1._M_head_impl[(ushort)(uVar16 - (uVar16 >> 8)) >> 4],
                               CONCAT22((_Var1._M_head_impl[(ushort)(uVar15 - (uVar15 >> 8)) >> 4]
                                        >> 8) + _Var1._M_head_impl
                                                [(ushort)(uVar15 - (uVar15 >> 8)) >> 4],
                                        (_Var1._M_head_impl
                                         [(ushort)((ushort)local_4040.rgba -
                                                  ((ushort)local_4040.rgba >> 8)) >> 4] >> 8) +
                                        _Var1._M_head_impl
                                        [(ushort)((ushort)local_4040.rgba -
                                                 ((ushort)local_4040.rgba >> 8)) >> 4])));
      }
      srcColor_00.rgba = local_4040.rgba;
      if (0 < mapHeight) {
        p_Var2 = destFetchProc64[rasterBuffer->format];
        p_Var3 = destStoreProc64[rasterBuffer->format];
        local_40b0 = 0;
        local_40b8 = map;
        local_4098 = (long)y;
        do {
          if (0 < mapWidth) {
            lVar6 = (long)y + local_40b0;
            bVar13 = true;
            iVar12 = x;
            uVar7 = mapWidth;
            do {
              uVar9 = 0x800;
              if ((int)uVar7 < 0x800) {
                uVar9 = (ulong)uVar7;
              }
              lVar11 = (long)iVar12;
              len = (int)uVar9;
              if ((0 < (int)uVar7) && (bVar13)) {
                uVar10 = 1;
                do {
                  uVar8 = *(uint *)(rasterBuffer->m_buffer +
                                   uVar10 * 4 +
                                   local_4098 * rasterBuffer->bytes_per_line + lVar11 * 4 + -4);
                  if (uVar9 <= uVar10) break;
                  uVar10 = uVar10 + 1;
                } while (0xfeffffff < uVar8);
                bVar13 = 0xfeffffff < uVar8;
              }
              if (bVar13) {
                qt_alphamapblit_argb32_oneline
                          (local_40b8 + (lVar11 - x),len,&local_4040,
                           (quint32 *)
                           (rasterBuffer->m_buffer +
                           lVar11 * 4 + rasterBuffer->bytes_per_line * lVar6),c,colorProfile);
              }
              else {
                iVar5 = (int)lVar6;
                dest = (*p_Var2)(local_4038,rasterBuffer,iVar12,iVar5,len);
                qt_alphamapblit_generic_oneline
                          (local_40b8 + (lVar11 - x),len,srcColor_00,dest,(QRgba64)color->rgba,
                           colorProfile);
                if (p_Var3 != (DestStoreProc64)0x0) {
                  (*p_Var3)(rasterBuffer,iVar12,iVar5,dest,len);
                }
              }
              iVar12 = iVar12 + len;
              uVar8 = uVar7 - len;
              bVar4 = len <= (int)uVar7;
              uVar7 = uVar8;
            } while (uVar8 != 0 && bVar4);
          }
          local_40b8 = local_40b8 + mapStride;
          local_40b0 = local_40b0 + 1;
          local_4098 = local_4098 + 1;
        } while (local_40b0 != (uint)mapHeight);
      }
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      return;
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    qt_alphamapblit_generic
              (rasterBuffer,x,y,color,map,mapWidth,mapHeight,mapStride,clip,useGammaCorrection);
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void qt_alphamapblit_nonpremul_argb32(QRasterBuffer *rasterBuffer,
                                             int x, int y, const QRgba64 &color,
                                             const uchar *map,
                                             int mapWidth, int mapHeight, int mapStride,
                                             const QClipData *clip, bool useGammaCorrection)
{
    if (clip)
        return qt_alphamapblit_generic(rasterBuffer, x, y, color, map, mapWidth, mapHeight,
                                       mapStride, clip, useGammaCorrection);

    if (color.isTransparent())
        return;

    const QColorTrcLut *colorProfile = nullptr;

    if (useGammaCorrection)
        colorProfile = QGuiApplicationPrivate::instance()->colorProfileForA8Text();

    const quint32 c = color.toArgb32();
    QRgba64 srcColor = color;
    if (colorProfile && color.isOpaque())
        srcColor = colorProfile->toLinear(srcColor);

    alignas(8) Q_DECL_UNINITIALIZED QRgba64 buffer[BufferSize];
    const DestFetchProc64 destFetch64 = destFetchProc64[rasterBuffer->format];
    const DestStoreProc64 destStore64 = destStoreProc64[rasterBuffer->format];

    for (int ly = 0; ly < mapHeight; ++ly) {
        bool dstFullyOpaque = true;
        int i = x;
        int length = mapWidth;
        while (length > 0) {
            int l = qMin(BufferSize, length);
            quint32 *dest = reinterpret_cast<quint32*>(rasterBuffer->scanLine(y + ly)) + i;
            for (int j = 0; j < l && dstFullyOpaque; ++j)
                dstFullyOpaque = (dest[j] & 0xff000000) == 0xff000000;
            if (dstFullyOpaque) {
                // Use RGB/ARGB32PM optimized version
                qt_alphamapblit_argb32_oneline(map + i - x, l, srcColor, dest, c, colorProfile);
            } else {
                // Use generic version
                QRgba64 *dest64 = destFetch64(buffer, rasterBuffer, i, y + ly, l);
                qt_alphamapblit_generic_oneline(map + i - x, l,
                                                srcColor, dest64, color,
                                                colorProfile);
                if (destStore64)
                    destStore64(rasterBuffer, i, y + ly, dest64, l);
            }
            length -= l;
            i += l;
        }
        map += mapStride;
    }
}